

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

void __thiscall SQTable::SQTable(SQTable *this,SQSharedState *ss,SQInteger nInitialSize)

{
  long in_RDX;
  SQSharedState *in_RSI;
  SQCollectable_conflict *in_RDI;
  SQInteger pow2size;
  SQDelegable *in_stack_ffffffffffffffd0;
  long local_20;
  
  SQDelegable::SQDelegable(in_stack_ffffffffffffffd0);
  (in_RDI->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQTable_00159898;
  for (local_20 = 4; local_20 < in_RDX; local_20 = local_20 << 1) {
  }
  AllocNodes((SQTable *)in_RSI,in_RDX);
  in_RDI[1]._prev = (SQCollectable_conflict *)0x0;
  in_RDI[1].super_SQRefCounted._vptr_SQRefCounted = (_func_int **)0x0;
  in_RDI->_next = (SQCollectable_conflict *)0x0;
  in_RDI->_prev = (SQCollectable_conflict *)0x0;
  in_RDI->_sharedstate = in_RSI;
  SQCollectable::AddToChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
  return;
}

Assistant:

SQTable::SQTable(SQSharedState *ss,SQInteger nInitialSize)
{
    SQInteger pow2size=MINPOWER2;
    while(nInitialSize>pow2size)pow2size=pow2size<<1;
    AllocNodes(pow2size);
    _usednodes = 0;
    _delegate = NULL;
    INIT_CHAIN();
    ADD_TO_CHAIN(&_sharedstate->_gc_chain,this);
}